

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  uint uVar1;
  RepeatedField<int> *pRVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  Extension *pEVar4;
  bool bVar5;
  int iVar6;
  LogMessage *pLVar7;
  MessageLite *pMVar8;
  undefined4 extraout_var;
  Type *value;
  Extension *extension;
  LogFinisher local_d1;
  Extension *local_d0;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  long *plVar9;
  
  bVar5 = MaybeNewExtension(this,*(int *)(descriptor + 0x28),descriptor,&local_d0);
  if (bVar5) {
    uVar1 = *(uint *)(descriptor + 0x2c);
    local_d0->type = (FieldType)uVar1;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(uVar1 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xbe);
      pLVar7 = LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_c8,pLVar7);
      LogMessage::~LogMessage(&local_90);
    }
    pEVar4 = local_d0;
    local_d0->is_repeated = true;
    pMVar8 = (MessageLite *)operator_new(0x18);
    pMVar8->_vptr_MessageLite = (_func_int **)0x0;
    pMVar8[1]._vptr_MessageLite = (_func_int **)0x0;
    *(undefined4 *)&pMVar8[2]._vptr_MessageLite = 0;
    (pEVar4->field_0).message_value = pMVar8;
  }
  else {
    if (local_d0->is_repeated == false) {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      pLVar7 = LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_REPEATED): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_c8,pLVar7);
      LogMessage::~LogMessage(&local_90);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_d0->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      pLVar7 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_c8,pLVar7);
      LogMessage::~LogMessage(&local_58);
    }
  }
  pRVar2 = (local_d0->field_0).repeated_int32_value;
  iVar6 = pRVar2->current_size_;
  if (iVar6 < pRVar2->total_size_) {
    pRVar2->current_size_ = iVar6 + 1;
    value = *(Type **)(pRVar2->elements_ + (long)iVar6 * 2);
  }
  else {
    value = (Type *)0x0;
  }
  if (value == (Type *)0x0) {
    pRVar3 = (local_d0->field_0).repeated_string_value;
    iVar6 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
    if (iVar6 == 0) {
      iVar6 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(descriptor + 0x48));
      plVar9 = (long *)CONCAT44(extraout_var,iVar6);
      if (plVar9 == (long *)0x0) {
        LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                   ,0xce);
        pLVar7 = LogMessage::operator<<(&local_c8,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_d1,pLVar7);
        LogMessage::~LogMessage(&local_c8);
      }
    }
    else {
      if (iVar6 < 1) {
        LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar7 = LogMessage::operator<<(&local_c8,"CHECK failed: (index) < (size()): ");
        LogFinisher::operator=(&local_d1,pLVar7);
        LogMessage::~LogMessage(&local_c8);
      }
      plVar9 = (long *)*(pRVar3->super_RepeatedPtrFieldBase).elements_;
    }
    value = (Type *)(**(code **)(*plVar9 + 0x18))(plVar9);
    RepeatedPtrFieldBase::
    AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(local_d0->field_0).string_value,value);
  }
  return value;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
      new RepeatedPtrField<MessageLite>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New();
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}